

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_logger.cpp
# Opt level: O0

void duckdb::SQLLogicTestLogger::LoadDatabaseFail(string *dbpath,string *message)

{
  idx_t in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  string local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  string local_50 [32];
  string local_30 [48];
  
  std::__cxx11::string::string(local_30);
  std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  PrintErrorHeader(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(string *)0x7c894f);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  PrintLineSep();
  std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::operator+(in_stack_ffffffffffffff68,(char *)in_stack_ffffffffffffff60);
  Log((string *)0x7c89a8);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
  PrintLineSep();
  return;
}

Assistant:

void SQLLogicTestLogger::LoadDatabaseFail(const string &dbpath, const string &message) {
	PrintErrorHeader(string(), 0, "Failed to load database " + dbpath);
	PrintLineSep();
	Log("Error message: " + message + "\n");
	PrintLineSep();
}